

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

size_t __thiscall caffe::FillerParameter::ByteSizeLong(FillerParameter *this)

{
  byte bVar1;
  uint uVar2;
  UnknownFieldSet *unknown_fields;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    sVar5 = 0;
  }
  else {
    unknown_fields = FillerParameter::unknown_fields(this);
    sVar5 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  bVar1 = (byte)(this->_has_bits_).has_bits_[0];
  uVar2 = (uint)bVar1;
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      sVar3 = google::protobuf::internal::WireFormatLite::StringSize((this->type_).ptr_);
      sVar5 = sVar5 + sVar3 + 1;
      uVar2 = (this->_has_bits_).has_bits_[0];
    }
    sVar3 = sVar5 + 5;
    if ((uVar2 & 2) == 0) {
      sVar3 = sVar5;
    }
    sVar5 = sVar3 + 5;
    if ((uVar2 & 4) == 0) {
      sVar5 = sVar3;
    }
    sVar3 = sVar5 + 5;
    if ((uVar2 & 8) == 0) {
      sVar3 = sVar5;
    }
    if ((uVar2 & 0x10) != 0) {
      sVar5 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                        (this->variance_norm_);
      sVar3 = sVar3 + sVar5 + 1;
      uVar2 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar2 & 0x20) != 0) {
      sVar5 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->sparse_);
      sVar3 = sVar3 + sVar5 + 1;
      uVar2 = (this->_has_bits_).has_bits_[0];
    }
    sVar4 = sVar3 + 5;
    if ((uVar2 & 0x40) == 0) {
      sVar4 = sVar3;
    }
    sVar5 = sVar4 + 5;
    if (-1 < (char)uVar2) {
      sVar5 = sVar4;
    }
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t FillerParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.FillerParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 255u) {
    // optional string type = 1 [default = "constant"];
    if (has_type()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->type());
    }

    // optional float value = 2 [default = 0];
    if (has_value()) {
      total_size += 1 + 4;
    }

    // optional float min = 3 [default = 0];
    if (has_min()) {
      total_size += 1 + 4;
    }

    // optional float mean = 5 [default = 0];
    if (has_mean()) {
      total_size += 1 + 4;
    }

    // optional .caffe.FillerParameter.VarianceNorm variance_norm = 8 [default = FAN_IN];
    if (has_variance_norm()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->variance_norm());
    }

    // optional int32 sparse = 7 [default = -1];
    if (has_sparse()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->sparse());
    }

    // optional float max = 4 [default = 1];
    if (has_max()) {
      total_size += 1 + 4;
    }

    // optional float std = 6 [default = 1];
    if (has_std()) {
      total_size += 1 + 4;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}